

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-stairs.c
# Opt level: O2

_Bool borg_flow_stair_less(int why,_Bool sneak)

{
  _Bool _Var1;
  int16_t iVar2;
  byte avoid;
  long lVar3;
  
  if (((player->opts).opt[0x20] == false) && (track_less.num != 0)) {
    borg_flow_clear();
    iVar2 = track_less.num;
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      if (borg_grids[track_less.y[lVar3]][track_less.x[lVar3]].kill == '\0') {
        borg_flow_enqueue_grid(track_less.y[lVar3],track_less.x[lVar3]);
        iVar2 = track_less.num;
      }
    }
    if ((borg.trait[0x23] < 0x24) && (borg.trait[0x1a] != 0)) {
      avoid = borg_desperate ^ 1;
      _Var1 = false;
    }
    else {
      _Var1 = true;
      avoid = false;
    }
    borg_flow_spread(L'ú',_Var1,(_Bool)avoid,false,L'\xffffffff',sneak);
    _Var1 = borg_flow_commit("up-stairs",why);
    if (_Var1) {
      _Var1 = borg_flow_old(why);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool borg_flow_stair_less(int why, bool sneak)
{
    int i;

    /* forced to go up */
    if (OPT(player, birth_force_descend))
        return false;

    /* None to flow to */
    if (!track_less.num)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Enqueue useful grids */
    for (i = 0; i < track_less.num; i++) {
        /* Not if a monster is parked on the stair */
        if (borg_grids[track_less.y[i]][track_less.x[i]].kill)
            continue;

        /* Enqueue the grid */
        borg_flow_enqueue_grid(track_less.y[i], track_less.x[i]);
    }

    if (borg.trait[BI_CLEVEL] > 35 || borg.trait[BI_LIGHT] == 0) {
        /* Spread the flow */
        borg_flow_spread(250, true, false, false, -1, sneak);
    } else {
        /* Spread the flow, No Optimize, Avoid */
        borg_flow_spread(250, false, !borg_desperate, false, -1, sneak);
    }

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("up-stairs", why))
        return false;

    /* Take one step */
    if (!borg_flow_old(why))
        return false;

    /* Success */
    return true;
}